

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_Superellipsoid.cpp
# Opt level: O3

Point3 * __thiscall
sch::S_Superellipsoid::l_Support
          (Point3 *__return_storage_ptr__,S_Superellipsoid *this,Vector3 *v,int *param_2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 local_68 [80];
  
  dVar9 = ABS(v->m_x) * this->a_;
  dVar8 = ABS(v->m_y) * this->b_;
  dVar4 = this->c_;
  dVar7 = ABS(v->m_z) * dVar4;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar4 = pow(dVar8 / dVar9,this->_2on2_e2);
    auVar6._0_8_ = 1.0 / (dVar4 + 1.0);
    if ((auVar6._0_8_ != 1.0) || (NAN(auVar6._0_8_))) {
      dVar4 = pow(1.0 - auVar6._0_8_,this->_2_e2on2);
      auVar5._0_8_ = dVar4 / (dVar8 / dVar9);
      auVar6._8_8_ = 1.0 - auVar6._0_8_;
      auVar5._8_8_ = dVar4;
      local_68._0_16_ = divpd(auVar6,auVar5);
      dVar8 = (dVar7 * dVar4) / dVar8;
      goto LAB_00178231;
    }
    local_68._0_8_ = 0x3ff0000000000000;
    local_68._8_8_ = 0;
  }
  else {
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      uVar1 = -(ulong)(0.0 < v->m_z);
      __return_storage_ptr__->m_x = 0.0;
      __return_storage_ptr__->m_y = 0.0;
      __return_storage_ptr__->m_z = (double)(~uVar1 & (ulong)-dVar4 | (ulong)dVar4 & uVar1);
      return __return_storage_ptr__;
    }
    local_68._0_8_ = 0;
    local_68._8_8_ = 0x3ff0000000000000;
    dVar9 = dVar8;
  }
  dVar8 = dVar7 / dVar9;
LAB_00178231:
  dVar4 = pow(dVar8,this->_2on2_e1);
  dVar4 = 1.0 / (dVar4 + 1.0);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    dVar9 = pow(1.0 - dVar4,this->_2_e1on2);
    dVar7 = dVar4 / (dVar9 / dVar8);
    dVar4 = ((1.0 - dVar4) / dVar9) * this->c_;
    uVar1 = -(ulong)(0.0 < v->m_z);
    dVar9 = (double)local_68._0_8_ * dVar7 * this->a_;
    dVar7 = (double)local_68._8_8_ * dVar7 * this->b_;
    uVar2 = -(ulong)(0.0 < v->m_x);
    uVar3 = -(ulong)(0.0 < v->m_y);
    __return_storage_ptr__->m_x = (double)(~uVar2 & (ulong)-dVar9 | (ulong)dVar9 & uVar2);
    __return_storage_ptr__->m_y = (double)(~uVar3 & (ulong)-dVar7 | (ulong)dVar7 & uVar3);
    __return_storage_ptr__->m_z = (double)(~uVar1 & (ulong)-dVar4 | uVar1 & (ulong)dVar4);
  }
  else {
    dVar4 = (double)local_68._0_8_ * this->a_;
    dVar9 = (double)local_68._8_8_ * this->b_;
    uVar1 = -(ulong)(0.0 < v->m_x);
    uVar2 = -(ulong)(0.0 < v->m_y);
    __return_storage_ptr__->m_x = (double)(~uVar1 & (ulong)-dVar4 | (ulong)dVar4 & uVar1);
    __return_storage_ptr__->m_y = (double)(~uVar2 & (ulong)-dVar9 | (ulong)dVar9 & uVar2);
    __return_storage_ptr__->m_z = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Point3 S_Superellipsoid::l_Support(const Vector3 & v, int & /*lastFeature*/) const
{
  Scalar anx, bny, cnz;

  anx = a_ * fabs(v[0]);
  bny = b_ * fabs(v[1]);
  cnz = c_ * fabs(v[2]);

  Scalar cp2, sp2, sp2e, cp2e, spe, cpe, tt1, tt2, ct2;

  if(anx == 0)
  {
    if(bny == 0)
    {
      return Point3(0, 0, c_ * sign(v[2]));
    }
    else
    {
      cp2 = 0;
      sp2 = 1;
      cp2e = 0;
      sp2e = 1;
      cpe = 0;
      spe = 1;
      tt1 = cnz / bny;
    }
  }
  else
  {
    Scalar tp1 = bny / anx;
    Scalar tp2 = pow(tp1, _2on2_e2);
    cp2 = 1 / (tp2 + 1);

    if(cp2 == 1)
    {
      sp2 = 0;
      cp2e = 1;
      sp2e = 0;
      cpe = 1;
      spe = 0;
      tt1 = cnz / anx;
    }
    else
    {
      sp2 = 1 - cp2;
      sp2e = pow(sp2, _2_e2on2);
      cp2e = sp2e / tp1;
      spe = sp2 / sp2e;
      cpe = cp2 / cp2e;
      tt1 = cnz * sp2e / bny;
    }
  }

  tt2 = pow(tt1, _2on2_e1);
  ct2 = 1 / (tt2 + 1);

  if(ct2 == 1)
  {
    return Point3(a_ * cpe * sign(v[0]), b_ * spe * sign(v[1]), 0);
  }
  else
  {
    Scalar st2 = 1 - ct2;
    Scalar st2e = pow(st2, _2_e1on2);
    Scalar ct2e = st2e / tt1;
    Scalar ste = st2 / st2e;
    Scalar cte = ct2 / ct2e;
    return Point3(a_ * cte * cpe * sign(v[0]), b_ * cte * spe * sign(v[1]), c_ * ste * sign(v[2]));
  }
}